

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiteralMiniIndex.hpp
# Opt level: O1

bool __thiscall Indexing::LiteralMiniIndex::InstanceIterator::hasNext(InstanceIterator *this)

{
  Entry *pEVar1;
  bool bVar2;
  Entry *pEVar3;
  uint uVar4;
  
  bVar2 = true;
  if ((this->super_IteratorBase)._ready == false) {
    pEVar3 = (this->super_IteratorBase)._curr;
    uVar4 = pEVar3->_header;
    while (uVar4 == (this->super_IteratorBase)._hdr) {
      bVar2 = Kernel::MatchingUtils::match
                        ((this->super_IteratorBase)._query,pEVar3->_lit,
                         (this->super_IteratorBase)._compl);
      if (bVar2) {
        (this->super_IteratorBase)._ready = true;
        return true;
      }
      pEVar1 = (this->super_IteratorBase)._curr;
      pEVar3 = pEVar1 + 1;
      (this->super_IteratorBase)._curr = pEVar3;
      uVar4 = pEVar1[1]._header;
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool hasNext()
    {
      if(_ready) { return true; }
      while(_curr->_header==_hdr) {
        if(MatchingUtils::match(_query, _curr->_lit, _compl)) {
          _ready=true;
          return true;
        }
        _curr++;
      }
      return false;
    }